

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_field.cc
# Opt level: O2

bool __thiscall Field::DoTraverse(Field *this,DataDepVisitor *visitor)

{
  bool bVar1;
  bool bVar2;
  pointer ppAVar3;
  
  if ((this->type_ == (Type *)0x0) ||
     (bVar1 = DataDepElement::Traverse(&this->type_->super_DataDepElement,visitor), bVar1)) {
    if (this->attrs_ == (AttrList *)0x0) {
      bVar1 = true;
    }
    else {
      ppAVar3 = (this->attrs_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      do {
        bVar1 = ppAVar3 ==
                (this->attrs_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = DataDepElement::Traverse(&(*ppAVar3)->super_DataDepElement,visitor);
        ppAVar3 = ppAVar3 + 1;
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Field::DoTraverse(DataDepVisitor* visitor)
	{
	// Check parameterized type
	if ( type_ && ! type_->Traverse(visitor) )
		return false;
	foreach (i, AttrList, attrs_)
		if ( ! (*i)->Traverse(visitor) )
			return false;
	return true;
	}